

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

void draco::parser::SkipWhitespace(DecoderBuffer *buffer)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  lVar1 = buffer->data_size_;
  lVar2 = buffer->pos_;
  bVar5 = false;
  while( true ) {
    lVar7 = lVar2 + 1;
    uVar6 = 0;
    if (lVar7 <= lVar1) {
      uVar6 = (uint)(byte)buffer->data_[lVar2];
    }
    bVar8 = true;
    bVar3 = true;
    if (lVar7 <= lVar1) {
      iVar4 = isspace(uVar6);
      bVar8 = iVar4 == 0;
      bVar3 = bVar5;
    }
    if ((bVar8) || (bVar3)) break;
    buffer->pos_ = lVar7;
    lVar2 = lVar7;
    bVar5 = bVar3;
  }
  return;
}

Assistant:

void SkipWhitespace(DecoderBuffer *buffer) {
  bool end_reached = false;
  while (PeekWhitespace(buffer, &end_reached) && !end_reached) {
    // Skip the whitespace character
    buffer->Advance(1);
  }
}